

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

void luaV_concat(lua_State *L,int total)

{
  long lVar1;
  char *pcVar2;
  byte bVar3;
  ulong uVar4;
  TString *pTVar5;
  byte bVar6;
  long lVar7;
  long lVar8;
  void *pvVar9;
  ulong l;
  StkId pSVar10;
  StkId pSVar11;
  size_t sVar12;
  int iVar13;
  ulong uVar14;
  char buff [40];
  char local_58 [40];
  
  if (total != 1) {
    pSVar10 = (L->top).p;
    do {
      if ((byte)((*(byte *)((long)pSVar10 + -0x18) & 0xf) - 3) < 2) {
        bVar3 = *(byte *)((long)pSVar10 + -8);
        if ((bVar3 & 0xf) != 4) {
          if ((bVar3 & 0xf) != 3) goto LAB_001204cf;
          luaO_tostring(L,&pSVar10[-1].val);
          bVar3 = *(byte *)((long)pSVar10 + -8);
        }
        pSVar11 = pSVar10 + -2;
        if (bVar3 == 0x44) {
          bVar6 = *(byte *)((long)pSVar10 + -0x18);
          if (pSVar10[-1].val.value_.f[0xb] != (_func_int_lua_State_ptr)0x0) goto LAB_001204e5;
          iVar13 = 1;
          if ((bVar6 & 0xf) == 3) {
            luaO_tostring(L,&pSVar11->val);
          }
        }
        else {
          bVar6 = *(byte *)((long)pSVar10 + -0x18);
LAB_001204e5:
          if ((bVar6 == 0x44) && ((pSVar11->val).value_.f[0xb] == (_func_int_lua_State_ptr)0x0)) {
            pSVar10[-2].val.value_ = pSVar10[-1].val.value_;
            *(byte *)((long)pSVar10 + -0x18) = bVar3;
            goto LAB_001204d7;
          }
          lVar7 = *(long *)(pSVar10 + -1);
          l = (ulong)*(char *)(lVar7 + 0xb);
          if ((long)l < 0) {
            l = *(ulong *)(lVar7 + 0x10);
          }
          uVar14 = 1;
          if (1 < total) {
            uVar14 = 1;
            do {
              bVar3 = (pSVar11->val).tt_ & 0xf;
              if (bVar3 != 4) {
                if (bVar3 != 3) goto LAB_0012056c;
                luaO_tostring(L,&pSVar11->val);
              }
              uVar4 = (ulong)*(char *)(*(long *)pSVar11 + 0xb);
              if ((long)uVar4 < 0) {
                uVar4 = *(ulong *)(*(long *)pSVar11 + 0x10);
              }
              if (0x7fffffffffffffcf - l <= uVar4) {
                (L->top).p = pSVar10 + -(ulong)(uint)total;
                luaG_runerror(L,"string length overflow");
              }
              l = l + uVar4;
              uVar14 = uVar14 + 1;
              pSVar11 = pSVar11 + -1;
            } while ((uint)total != uVar14);
            uVar14 = (ulong)(uint)total;
          }
LAB_0012056c:
          uVar4 = uVar14 & 0xffffffff;
          if (l < 0x29) {
            lVar7 = uVar4 + 1;
            pSVar11 = pSVar10 + -uVar4;
            lVar8 = 0;
            do {
              lVar1 = *(long *)pSVar11;
              sVar12 = (size_t)*(char *)(lVar1 + 0xb);
              if ((long)sVar12 < 0) {
                sVar12 = *(size_t *)(lVar1 + 0x10);
                pvVar9 = *(void **)(lVar1 + 0x18);
              }
              else {
                pvVar9 = (void *)(lVar1 + 0x18);
              }
              memcpy(local_58 + lVar8,pvVar9,sVar12);
              lVar8 = lVar8 + sVar12;
              lVar7 = lVar7 + -1;
              pSVar11 = pSVar11 + 1;
            } while (1 < lVar7);
            pTVar5 = luaS_newlstr(L,local_58,l);
          }
          else {
            pTVar5 = luaS_createlngstrobj(L,l);
            pcVar2 = pTVar5->contents;
            lVar7 = uVar4 + 1;
            pSVar11 = pSVar10 + -uVar4;
            lVar8 = 0;
            do {
              lVar1 = *(long *)pSVar11;
              sVar12 = (size_t)*(char *)(lVar1 + 0xb);
              if ((long)sVar12 < 0) {
                sVar12 = *(size_t *)(lVar1 + 0x10);
                pvVar9 = *(void **)(lVar1 + 0x18);
              }
              else {
                pvVar9 = (void *)(lVar1 + 0x18);
              }
              memcpy(pcVar2 + lVar8,pvVar9,sVar12);
              lVar8 = lVar8 + sVar12;
              lVar7 = lVar7 + -1;
              pSVar11 = pSVar11 + 1;
            } while (1 < lVar7);
          }
          *(TString **)(pSVar10 + -uVar4) = pTVar5;
          pSVar10[-uVar4].val.tt_ = pTVar5->tt | 0x40;
          iVar13 = (int)uVar14 + -1;
        }
      }
      else {
LAB_001204cf:
        luaT_tryconcatTM(L);
LAB_001204d7:
        iVar13 = 1;
      }
      total = total - iVar13;
      pSVar10 = (L->top).p + -(long)iVar13;
      (L->top).p = pSVar10;
    } while (1 < total);
  }
  return;
}

Assistant:

void luaV_concat (lua_State *L, int total) {
  if (total == 1)
    return;  /* "all" values already concatenated */
  do {
    StkId top = L->top.p;
    int n = 2;  /* number of elements handled in this pass (at least 2) */
    if (!(ttisstring(s2v(top - 2)) || cvt2str(s2v(top - 2))) ||
        !tostring(L, s2v(top - 1)))
      luaT_tryconcatTM(L);  /* may invalidate 'top' */
    else if (isemptystr(s2v(top - 1)))  /* second operand is empty? */
      cast_void(tostring(L, s2v(top - 2)));  /* result is first operand */
    else if (isemptystr(s2v(top - 2))) {  /* first operand is empty string? */
      setobjs2s(L, top - 2, top - 1);  /* result is second op. */
    }
    else {
      /* at least two non-empty string values; get as many as possible */
      size_t tl = tsslen(tsvalue(s2v(top - 1)));
      TString *ts;
      /* collect total length and number of strings */
      for (n = 1; n < total && tostring(L, s2v(top - n - 1)); n++) {
        size_t l = tsslen(tsvalue(s2v(top - n - 1)));
        if (l_unlikely(l >= MAX_SIZE - sizeof(TString) - tl)) {
          L->top.p = top - total;  /* pop strings to avoid wasting stack */
          luaG_runerror(L, "string length overflow");
        }
        tl += l;
      }
      if (tl <= LUAI_MAXSHORTLEN) {  /* is result a short string? */
        char buff[LUAI_MAXSHORTLEN];
        copy2buff(top, n, buff);  /* copy strings to buffer */
        ts = luaS_newlstr(L, buff, tl);
      }
      else {  /* long string; copy strings directly to final result */
        ts = luaS_createlngstrobj(L, tl);
        copy2buff(top, n, getlngstr(ts));
      }
      setsvalue2s(L, top - n, ts);  /* create result */
    }
    total -= n - 1;  /* got 'n' strings to create one new */
    L->top.p -= n - 1;  /* popped 'n' strings and pushed one */
  } while (total > 1);  /* repeat until only 1 result left */
}